

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlignDefault_IsAligned_Test::
~ArenaAlignDefault_IsAligned_Test(ArenaAlignDefault_IsAligned_Test *this)

{
  ArenaAlignDefault_IsAligned_Test *this_local;
  
  ~ArenaAlignDefault_IsAligned_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaAlignDefault, IsAligned) {
  auto align_default = ArenaAlignDefault();
  EXPECT_TRUE(align_default.IsAligned(0));
  EXPECT_FALSE(align_default.IsAligned(1));
  EXPECT_FALSE(align_default.IsAligned(7));
  EXPECT_TRUE(align_default.IsAligned(8));
  EXPECT_FALSE(align_default.IsAligned(9));
  EXPECT_FALSE(align_default.IsAligned(15));
  EXPECT_TRUE(align_default.IsAligned(16));
}